

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

void BinaryenStringIterNextSetRef(BinaryenExpressionRef expr,BinaryenExpressionRef refExpr)

{
  if (expr->_id != StringIterNextId) {
    __assert_fail("expression->is<StringIterNext>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x12c4,
                  "void BinaryenStringIterNextSetRef(BinaryenExpressionRef, BinaryenExpressionRef)")
    ;
  }
  if (refExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 1) = refExpr;
    return;
  }
  __assert_fail("refExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x12c5,
                "void BinaryenStringIterNextSetRef(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenStringIterNextSetRef(BinaryenExpressionRef expr,
                                  BinaryenExpressionRef refExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<StringIterNext>());
  assert(refExpr);
  static_cast<StringIterNext*>(expression)->ref = (Expression*)refExpr;
}